

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::ZSobolSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,ZSobolSampler *this,int n,Allocator alloc)

{
  RandomizeStrategy *pRVar1;
  pointer pSVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  ZSobolSampler *pZVar6;
  long lVar7;
  ZSobolSampler *pZVar8;
  ulong uVar9;
  allocator_type local_31;
  polymorphic_allocator<std::byte> local_30;
  
  local_30.memoryResource = alloc.memoryResource;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_31);
  pZVar6 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::ZSobolSampler>
                     (&local_30,(long)n);
  pSVar2 = (__return_storage_ptr__->
           super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pZVar8 = pZVar6;
  for (lVar7 = 0; (ulong)(uint)(~(n >> 0x1f) & n) << 3 != lVar7; lVar7 = lVar7 + 8) {
    uVar3 = *(undefined8 *)&this->seed;
    uVar4 = this->mortonIndex;
    uVar5 = *(undefined8 *)&this->dimension;
    uVar9 = (ulong)pZVar8 | 0x6000000000000;
    pZVar8 = pZVar8 + 1;
    pRVar1 = &pZVar6->randomizeStrategy + lVar7;
    *(undefined8 *)pRVar1 = *(undefined8 *)this;
    *(undefined8 *)(pRVar1 + 2) = uVar3;
    *(uint64_t *)(pRVar1 + 4) = uVar4;
    *(undefined8 *)(pRVar1 + 6) = uVar5;
    *(ulong *)((long)&(pSVar2->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits + lVar7) = uVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> ZSobolSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    ZSobolSampler *samplerMem = (ZSobolSampler *)alloc.allocate_object<ZSobolSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}